

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_sse4.c
# Opt level: O1

_Bool aom_compute_mean_stddev_sse4_1
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  short sVar7;
  double dVar3;
  short sVar5;
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar4 [16];
  short sVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double __x;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar22 [16];
  
  pauVar1 = (undefined1 (*) [16])(frame + (x + (y + -7) * stride + -7));
  auVar4 = (undefined1  [16])0x0;
  iVar2 = 0x10;
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  iVar17 = 0;
  iVar18 = 0;
  iVar19 = 0;
  do {
    auVar21 = *pauVar1;
    auVar22 = pmovzxbw(in_XMM5,auVar21);
    auVar20._0_2_ = CONCAT11(0,auVar21[8]);
    auVar20[2] = auVar21[9];
    auVar20[3] = 0;
    auVar20[4] = auVar21[10];
    auVar20[5] = 0;
    auVar20[6] = auVar21[0xb];
    auVar20[7] = 0;
    auVar20[8] = auVar21[0xc];
    auVar20[9] = 0;
    auVar20[10] = auVar21[0xd];
    auVar20[0xb] = 0;
    auVar20[0xc] = auVar21[0xe];
    auVar20[0xd] = 0;
    auVar20[0xe] = auVar21[0xf];
    auVar20[0xf] = 0;
    sVar5 = auVar4._2_2_;
    sVar6 = auVar4._4_2_;
    sVar7 = auVar4._6_2_;
    sVar8 = auVar4._8_2_;
    sVar9 = auVar4._10_2_;
    sVar10 = auVar4._12_2_;
    sVar11 = auVar4._14_2_;
    auVar4._0_2_ = auVar4._0_2_ + auVar20._0_2_ + auVar22._0_2_;
    auVar4._2_2_ = sVar5 + (ushort)auVar21[9] + auVar22._2_2_;
    auVar4._4_2_ = sVar6 + (ushort)auVar21[10] + auVar22._4_2_;
    auVar4._6_2_ = sVar7 + (ushort)auVar21[0xb] + auVar22._6_2_;
    auVar4._8_2_ = sVar8 + (ushort)auVar21[0xc] + auVar22._8_2_;
    auVar4._10_2_ = sVar9 + (ushort)auVar21[0xd] + auVar22._10_2_;
    auVar4._12_2_ = sVar10 + (ushort)auVar21[0xe] + auVar22._12_2_;
    auVar4._14_2_ = sVar11 + (ushort)auVar21[0xf] + auVar22._14_2_;
    in_XMM5 = pmaddwd(auVar22,auVar22);
    iVar12 = iVar12 + in_XMM5._0_4_;
    iVar13 = iVar13 + in_XMM5._4_4_;
    iVar14 = iVar14 + in_XMM5._8_4_;
    iVar15 = iVar15 + in_XMM5._12_4_;
    auVar21 = pmaddwd(auVar20,auVar20);
    iVar16 = iVar16 + auVar21._0_4_;
    iVar17 = iVar17 + auVar21._4_4_;
    iVar18 = iVar18 + auVar21._8_4_;
    iVar19 = iVar19 + auVar21._12_4_;
    pauVar1 = (undefined1 (*) [16])(*pauVar1 + stride);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  auVar4 = pmaddwd(auVar4,_DAT_005154e0);
  auVar21._0_4_ = iVar12 + iVar16;
  auVar21._4_4_ = iVar13 + iVar17;
  auVar21._8_4_ = iVar14 + iVar18;
  auVar21._12_4_ = iVar15 + iVar19;
  auVar4 = phaddd(auVar4,auVar21);
  auVar4 = phaddd(auVar4,auVar4);
  dVar3 = (double)auVar4._0_4_ * 0.0625;
  *mean = dVar3;
  __x = (double)auVar4._12_4_ - dVar3 * dVar3;
  dVar3 = 0.0;
  if (256.0 <= __x) {
    if (__x < 0.0) {
      dVar3 = sqrt(__x);
    }
    else {
      dVar3 = SQRT(__x);
    }
    dVar3 = 1.0 / dVar3;
  }
  *one_over_stddev = dVar3;
  return 256.0 <= __x;
}

Assistant:

bool aom_compute_mean_stddev_sse4_1(const unsigned char *frame, int stride,
                                    int x, int y, double *mean,
                                    double *one_over_stddev) {
  // 8 16-bit partial sums of pixels
  // Each lane sums at most 2*MATCH_SZ pixels, which can have values up to 255,
  // and is therefore at most 2*MATCH_SZ*255, which is > 2^8 but < 2^16.
  // Thus this value is safe to store in 16 bits.
  __m128i sum_vec = _mm_setzero_si128();

  // 8 32-bit partial sums of squares
  __m128i sumsq_vec_l = _mm_setzero_si128();
  __m128i sumsq_vec_r = _mm_setzero_si128();

  frame += (y - MATCH_SZ_BY2) * stride + (x - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m128i v = _mm_loadu_si128((__m128i *)frame);
    const __m128i v_l = _mm_cvtepu8_epi16(v);
    const __m128i v_r = _mm_cvtepu8_epi16(_mm_srli_si128(v, 8));

    sum_vec = _mm_add_epi16(sum_vec, _mm_add_epi16(v_l, v_r));
    sumsq_vec_l = _mm_add_epi32(sumsq_vec_l, _mm_madd_epi16(v_l, v_l));
    sumsq_vec_r = _mm_add_epi32(sumsq_vec_r, _mm_madd_epi16(v_r, v_r));

    frame += stride;
  }

  // Reduce sum_vec and sumsq_vec into single values
  // Start by reducing each vector to 4x32-bit values, hadd() to perform four
  // additions, then perform the last two additions in scalar code.
  const __m128i ones = _mm_load_si128((__m128i *)ones_array);
  const __m128i partial_sum = _mm_madd_epi16(sum_vec, ones);
  const __m128i partial_sumsq = _mm_add_epi32(sumsq_vec_l, sumsq_vec_r);
  const __m128i tmp = _mm_hadd_epi32(partial_sum, partial_sumsq);
  const int sum = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1);
  const int sumsq = _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}